

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3EvalTestExpr(Fts3Cursor *pCsr,Fts3Expr *pExpr,int *pRc)

{
  Fts3Phrase *pPhrase_00;
  int iVar1;
  int iVar2;
  bool local_4c;
  byte local_4b;
  bool local_4a;
  bool local_49;
  Fts3Phrase *pPhrase;
  int bHit2;
  int bHit1;
  Fts3Expr *p;
  int bHit;
  int *pRc_local;
  Fts3Expr *pExpr_local;
  Fts3Cursor *pCsr_local;
  
  p._4_4_ = 1;
  if (*pRc == 0) {
    switch(pExpr->eType) {
    case 1:
    case 3:
      iVar2 = fts3EvalTestExpr(pCsr,pExpr->pLeft,pRc);
      local_49 = false;
      if (iVar2 != 0) {
        iVar2 = fts3EvalTestExpr(pCsr,pExpr->pRight,pRc);
        local_49 = false;
        if (iVar2 != 0) {
          iVar2 = fts3EvalNearTest(pExpr,pRc);
          local_49 = iVar2 != 0;
        }
      }
      p._4_4_ = (uint)local_49;
      if (((p._4_4_ == 0) && (pExpr->eType == 1)) &&
         ((_bHit2 = pExpr, pExpr->pParent == (Fts3Expr *)0x0 || (pExpr->pParent->eType != 1)))) {
        for (; _bHit2->pPhrase == (Fts3Phrase *)0x0; _bHit2 = _bHit2->pLeft) {
          if (_bHit2->pRight->iDocid == pCsr->iPrevId) {
            fts3EvalInvalidatePoslist(_bHit2->pRight->pPhrase);
          }
        }
        if (_bHit2->iDocid == pCsr->iPrevId) {
          fts3EvalInvalidatePoslist(_bHit2->pPhrase);
        }
      }
      break;
    case 2:
      iVar2 = fts3EvalTestExpr(pCsr,pExpr->pLeft,pRc);
      local_4b = 0;
      if (iVar2 != 0) {
        iVar2 = fts3EvalTestExpr(pCsr,pExpr->pRight,pRc);
        local_4b = iVar2 != 0 ^ 0xff;
      }
      p._4_4_ = (uint)(local_4b & 1);
      break;
    case 4:
      iVar2 = fts3EvalTestExpr(pCsr,pExpr->pLeft,pRc);
      iVar1 = fts3EvalTestExpr(pCsr,pExpr->pRight,pRc);
      local_4a = iVar2 != 0 || iVar1 != 0;
      p._4_4_ = (uint)local_4a;
      break;
    default:
      if ((pCsr->pDeferred == (Fts3DeferredToken *)0x0) ||
         ((pExpr->iDocid != pCsr->iPrevId && (pExpr->bDeferred == '\0')))) {
        local_4c = false;
        if (pExpr->bEof == '\0') {
          local_4c = pExpr->iDocid == pCsr->iPrevId;
        }
      }
      else {
        pPhrase_00 = pExpr->pPhrase;
        if (pExpr->bDeferred != '\0') {
          fts3EvalInvalidatePoslist(pPhrase_00);
        }
        iVar2 = fts3EvalDeferredPhrase(pCsr,pPhrase_00);
        *pRc = iVar2;
        local_4c = (pPhrase_00->doclist).pList != (char *)0x0;
        pExpr->iDocid = pCsr->iPrevId;
      }
      p._4_4_ = (uint)local_4c;
    }
  }
  return p._4_4_;
}

Assistant:

static int fts3EvalTestExpr(
  Fts3Cursor *pCsr,               /* FTS cursor handle */
  Fts3Expr *pExpr,                /* Expr to test. May or may not be root. */
  int *pRc                        /* IN/OUT: Error code */
){
  int bHit = 1;                   /* Return value */
  if( *pRc==SQLITE_OK ){
    switch( pExpr->eType ){
      case FTSQUERY_NEAR:
      case FTSQUERY_AND:
        bHit = (
            fts3EvalTestExpr(pCsr, pExpr->pLeft, pRc)
         && fts3EvalTestExpr(pCsr, pExpr->pRight, pRc)
         && fts3EvalNearTest(pExpr, pRc)
        );

        /* If the NEAR expression does not match any rows, zero the doclist for 
        ** all phrases involved in the NEAR. This is because the snippet(),
        ** offsets() and matchinfo() functions are not supposed to recognize 
        ** any instances of phrases that are part of unmatched NEAR queries. 
        ** For example if this expression:
        **
        **    ... MATCH 'a OR (b NEAR c)'
        **
        ** is matched against a row containing:
        **
        **        'a b d e'
        **
        ** then any snippet() should ony highlight the "a" term, not the "b"
        ** (as "b" is part of a non-matching NEAR clause).
        */
        if( bHit==0 
         && pExpr->eType==FTSQUERY_NEAR 
         && (pExpr->pParent==0 || pExpr->pParent->eType!=FTSQUERY_NEAR)
        ){
          Fts3Expr *p;
          for(p=pExpr; p->pPhrase==0; p=p->pLeft){
            if( p->pRight->iDocid==pCsr->iPrevId ){
              fts3EvalInvalidatePoslist(p->pRight->pPhrase);
            }
          }
          if( p->iDocid==pCsr->iPrevId ){
            fts3EvalInvalidatePoslist(p->pPhrase);
          }
        }

        break;

      case FTSQUERY_OR: {
        int bHit1 = fts3EvalTestExpr(pCsr, pExpr->pLeft, pRc);
        int bHit2 = fts3EvalTestExpr(pCsr, pExpr->pRight, pRc);
        bHit = bHit1 || bHit2;
        break;
      }

      case FTSQUERY_NOT:
        bHit = (
            fts3EvalTestExpr(pCsr, pExpr->pLeft, pRc)
         && !fts3EvalTestExpr(pCsr, pExpr->pRight, pRc)
        );
        break;

      default: {
#ifndef SQLITE_DISABLE_FTS4_DEFERRED
        if( pCsr->pDeferred 
         && (pExpr->iDocid==pCsr->iPrevId || pExpr->bDeferred)
        ){
          Fts3Phrase *pPhrase = pExpr->pPhrase;
          assert( pExpr->bDeferred || pPhrase->doclist.bFreeList==0 );
          if( pExpr->bDeferred ){
            fts3EvalInvalidatePoslist(pPhrase);
          }
          *pRc = fts3EvalDeferredPhrase(pCsr, pPhrase);
          bHit = (pPhrase->doclist.pList!=0);
          pExpr->iDocid = pCsr->iPrevId;
        }else
#endif
        {
          bHit = (pExpr->bEof==0 && pExpr->iDocid==pCsr->iPrevId);
        }
        break;
      }
    }
  }
  return bHit;
}